

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GC.cpp
# Opt level: O3

void __thiscall luna::GC::MinorGCMark(GC *this)

{
  _Elt_pointer ppGVar1;
  GCObject *pGVar2;
  _Map_pointer pppGVar3;
  _Elt_pointer ppGVar4;
  _Elt_pointer ppGVar5;
  BarrieredMarkVisitor barriered_maker;
  MinorMarkVisitor marker;
  GCObjectVisitor *local_38;
  GCObjectVisitor local_30;
  
  if ((this->minor_traveller_).super__Function_base._M_manager == (_Manager_type)0x0) {
    __assert_fail("minor_traveller_",
                  "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/GC.cpp",
                  0x112,"void luna::GC::MinorGCMark()");
  }
  local_38 = &local_30;
  local_30._vptr_GCObjectVisitor = (_func_int **)&PTR_Visit_00115b68;
  (*(this->minor_traveller_)._M_invoker)((_Any_data *)&this->minor_traveller_,&local_38);
  local_38 = (GCObjectVisitor *)&PTR_Visit_00115bd0;
  ppGVar5 = (this->barriered_).
            super__Deque_base<luna::GCObject_*,_std::allocator<luna::GCObject_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  ppGVar1 = (this->barriered_).
            super__Deque_base<luna::GCObject_*,_std::allocator<luna::GCObject_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  if (ppGVar5 != ppGVar1) {
    ppGVar4 = (this->barriered_).
              super__Deque_base<luna::GCObject_*,_std::allocator<luna::GCObject_*>_>._M_impl.
              super__Deque_impl_data._M_start._M_last;
    pppGVar3 = (this->barriered_).
               super__Deque_base<luna::GCObject_*,_std::allocator<luna::GCObject_*>_>._M_impl.
               super__Deque_impl_data._M_start._M_node;
    do {
      pGVar2 = *ppGVar5;
      if ((pGVar2->field_0x10 & 3) == 0) {
        __assert_fail("obj->generation_ != GCGen0",
                      "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/GC.cpp"
                      ,0x11d,"void luna::GC::MinorGCMark()");
      }
      pGVar2->field_0x10 = pGVar2->field_0x10 & 0xf3 | 4;
      (*pGVar2->_vptr_GCObject[2])(pGVar2,&local_38);
      ppGVar5 = ppGVar5 + 1;
      if (ppGVar5 == ppGVar4) {
        ppGVar5 = pppGVar3[1];
        pppGVar3 = pppGVar3 + 1;
        ppGVar4 = ppGVar5 + 0x40;
      }
    } while (ppGVar5 != ppGVar1);
  }
  return;
}

Assistant:

void GC::MinorGC()
    {
        unsigned int old_gen1_count = gen1_.count_;

        MinorGCMark();
        MinorGCSweep();

        barriered_.clear();

        // Caculate objects count from gen0_ to gen1_, which is how
        // many alived objects in gen0_ after mark-sweep, and adjust
        // gen0_'s threshold count by the alived_gen0_count
        unsigned int alived_gen0_count = gen1_.count_ - old_gen1_count;
        AdjustThreshold(alived_gen0_count, gen0_, kGen0InitThresholdCount,
                        kGen0MaxThresholdCount);
    }